

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall
HEkkDual::interpretDualEdgeWeightStrategy(HEkkDual *this,HighsInt dual_edge_weight_strategy)

{
  switch(dual_edge_weight_strategy) {
  case 0:
    this->edge_weight_mode = kDantzig;
    break;
  case 1:
    this->edge_weight_mode = kDevex;
    break;
  case 2:
    this->edge_weight_mode = kSteepestEdge;
    this->allow_dual_steepest_edge_to_devex_switch = false;
    break;
  default:
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkkDual::interpretDualEdgeWeightStrategy: unrecognised dual_edge_weight_strategy = %d - using dual steepest edge with possible switch to Devex\n"
               );
  case -1:
    this->edge_weight_mode = kSteepestEdge;
    this->allow_dual_steepest_edge_to_devex_switch = true;
  }
  return;
}

Assistant:

void HEkkDual::interpretDualEdgeWeightStrategy(
    const HighsInt dual_edge_weight_strategy) {
  if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyChoose) {
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = true;
  } else if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyDantzig) {
    edge_weight_mode = EdgeWeightMode::kDantzig;
  } else if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyDevex) {
    edge_weight_mode = EdgeWeightMode::kDevex;
  } else if (dual_edge_weight_strategy ==
             kSimplexEdgeWeightStrategySteepestEdge) {
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = false;
  } else {
    assert(1 == 0);
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkDual::interpretDualEdgeWeightStrategy: "
                "unrecognised dual_edge_weight_strategy = %" HIGHSINT_FORMAT
                " - using "
                "dual steepest edge with possible switch to Devex\n",
                dual_edge_weight_strategy);
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = true;
  }
}